

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O1

void __thiscall cali::Caliper::end(Caliper *this,Attribute *attr)

{
  ThreadData *pTVar1;
  GlobalData *pGVar2;
  pointer pCVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  cali_id_t cVar8;
  Node *pNVar9;
  cali_id_t cVar10;
  cali_id_t key;
  Blackboard *pBVar11;
  uint uVar12;
  mutex *pmVar13;
  Channel *channel;
  pointer pCVar14;
  Entry merged_entry;
  Node *local_88;
  Entry local_78;
  anon_union_8_7_33918203_for_value local_60;
  Entry local_58;
  Node *local_40;
  element_type *local_38;
  
  if (this->sT->stack_error != false) {
    return;
  }
  uVar4 = Attribute::properties(attr);
  uVar12 = uVar4 & 0x3c;
  if (attr->m_node == (Node *)0x0) {
    cVar10 = 0xffffffffffffffff;
  }
  else {
    cVar10 = attr->m_node->m_id;
  }
  key = (ulong)((uVar4 >> 10 & 1) != 0) + 1;
  if ((uVar4 & 1) != 0) {
    key = cVar10;
  }
  pTVar1 = this->sT;
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + 1;
  uVar7 = key;
  if (uVar12 == 0x14) {
    do {
      uVar6 = (ulong)(uint)(((int)uVar7 + (int)(uVar7 / 0x3fd) * -0x3fd) * 0x20);
      cVar10 = *(cali_id_t *)((long)&(pTVar1->thread_blackboard).hashtable[0].key + uVar6);
      if (cVar10 == key) break;
      uVar7 = uVar7 % 0x3fd + 1;
    } while (cVar10 != 0xffffffffffffffff);
    if (cVar10 == key) {
      local_78.m_value.m_v.value =
           *(anon_union_8_7_33918203_for_value *)
            ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_value.m_v.value + uVar6);
      local_78.m_node =
           *(Node **)((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_node + uVar6);
      local_78.m_value.m_v.type_and_size =
           *(uint64_t *)
            ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_value.m_v.type_and_size + uVar6
            );
    }
    else {
      local_78.m_node = (Node *)0x0;
      local_78.m_value.m_v.type_and_size = 0;
      local_78.m_value.m_v.value.v_uint = 0;
    }
    Entry::get(&local_58,&local_78,attr);
    cVar8 = 0xffffffffffffffff;
    cVar10 = 0xffffffffffffffff;
    if ((local_78.m_node != (Node *)0x0) && (cVar10 = (local_78.m_node)->m_attribute, cVar10 == 8))
    {
      cVar10 = (local_78.m_node)->m_id;
    }
    if (attr->m_node != (Node *)0x0) {
      cVar8 = attr->m_node->m_id;
    }
    if (cVar10 == cVar8) {
LAB_001e13d5:
      local_60 = local_58.m_value.m_v.value;
      local_88 = local_58.m_node;
      local_40 = local_78.m_node;
    }
    else {
      if (local_58.m_node == (Node *)0x0) {
        pNVar9 = (Node *)0x0;
      }
      else {
        pNVar9 = local_78.m_node;
        if (key == 2) goto LAB_001e13d5;
      }
      local_60.v_uint = 0;
      anon_unknown.dwarf_40ec13::log_stack_error(pNVar9,attr);
      local_58.m_value.m_v.type_and_size = 0;
      local_88 = (Node *)0x0;
      local_40 = (Node *)0x0;
    }
  }
  else {
    if (uVar12 != 0xc) goto LAB_001e16ad;
    pmVar13 = &this->sG->process_blackboard_lock;
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)pmVar13);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    pGVar2 = this->sG;
    cVar10 = key;
    do {
      uVar7 = (ulong)(uint)(((int)cVar10 + (int)(cVar10 / 0x3fd) * -0x3fd) * 0x20);
      cVar8 = *(cali_id_t *)((long)&(pGVar2->process_blackboard).hashtable[0].key + uVar7);
      if (cVar8 == key) break;
      cVar10 = cVar10 % 0x3fd + 1;
    } while (cVar8 != 0xffffffffffffffff);
    if (cVar8 == key) {
      local_78.m_value.m_v.value =
           *(anon_union_8_7_33918203_for_value *)
            ((long)&(pGVar2->process_blackboard).hashtable[0].value.m_value.m_v.value + uVar7);
      local_78.m_node =
           *(Node **)((long)&(pGVar2->process_blackboard).hashtable[0].value.m_node + uVar7);
      local_78.m_value.m_v.type_and_size =
           *(uint64_t *)
            ((long)&(pGVar2->process_blackboard).hashtable[0].value.m_value.m_v.type_and_size +
            uVar7);
    }
    else {
      local_78.m_node = (Node *)0x0;
      local_78.m_value.m_v.type_and_size = 0;
      local_78.m_value.m_v.value.v_uint = 0;
    }
    Entry::get(&local_58,&local_78,attr);
    cVar8 = 0xffffffffffffffff;
    cVar10 = 0xffffffffffffffff;
    if ((local_78.m_node != (Node *)0x0) && (cVar10 = (local_78.m_node)->m_attribute, cVar10 == 8))
    {
      cVar10 = (local_78.m_node)->m_id;
    }
    if (attr->m_node != (Node *)0x0) {
      cVar8 = attr->m_node->m_id;
    }
    if (cVar10 == cVar8) {
LAB_001e1457:
      local_88 = local_58.m_node;
      local_60 = local_58.m_value.m_v.value;
      local_40 = local_78.m_node;
    }
    else {
      if (local_58.m_node == (Node *)0x0) {
        pNVar9 = (Node *)0x0;
      }
      else {
        pNVar9 = local_78.m_node;
        if (key == 2) goto LAB_001e1457;
      }
      local_88 = (Node *)0x0;
      anon_unknown.dwarf_40ec13::log_stack_error(pNVar9,attr);
      local_40 = (Node *)0x0;
      local_58.m_value.m_v.type_and_size = 0;
      local_60.v_uint = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)pmVar13);
  }
  if (local_88 == (Node *)0x0) {
    this->sT->stack_error = true;
    goto LAB_001e16ad;
  }
  if ((uVar4 & 0x40) == 0) {
    pCVar14 = (this->sG->active_channels).
              super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar3 = (this->sG->active_channels).
             super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar14 != pCVar3) {
      do {
        local_38 = (pCVar14->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        local_78.m_value.m_v.type_and_size = local_60.v_uint;
        local_78.m_node = (Node *)local_58.m_value.m_v.type_and_size;
        local_58.m_node = (Node *)this;
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(((pCVar14->mP).
                           super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->events).pre_end_evt,(Caliper **)&local_58,&local_38,attr,
                     (Variant *)&local_78);
        pCVar14 = pCVar14 + 1;
      } while (pCVar14 != pCVar3);
    }
  }
  if (uVar12 == 0x14) {
    pBVar11 = &this->sT->thread_blackboard;
    if (((uVar4 & 1) == 0) &&
       (pNVar9 = *(Node **)((long)&(((local_40->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                   super_LockfreeIntrusiveTree<cali::Node>).m_me +
                           (local_40->super_LockfreeIntrusiveTree<cali::Node>).m_node),
       pNVar9 != (Node *)((long)internal::MetadataTree::mG._M_b._M_p + 0x10))) {
      if (local_40 != local_88) {
        pNVar9 = internal::MetadataTree::remove_first_in_path(&this->sT->tree,local_40,attr);
      }
      local_78.m_value.m_v.type_and_size = (pNVar9->m_data).m_v.type_and_size;
      local_78.m_value.m_v.value = (pNVar9->m_data).m_v.value;
      local_78.m_node = pNVar9;
      Blackboard::set(pBVar11,key,&local_78,-1 < (char)uVar4);
    }
    else {
      Blackboard::del(pBVar11,key);
    }
    goto LAB_001e16ad;
  }
  pmVar13 = &this->sG->process_blackboard_lock;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)pmVar13);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pBVar11 = &this->sG->process_blackboard;
  if ((uVar4 & 1) == 0) {
    pNVar9 = *(Node **)((long)&(((local_40->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                               super_LockfreeIntrusiveTree<cali::Node>).m_me +
                       (local_40->super_LockfreeIntrusiveTree<cali::Node>).m_node);
    if (pNVar9 == (Node *)((long)internal::MetadataTree::mG._M_b._M_p + 0x10)) goto LAB_001e169a;
    if (local_40 != local_88) {
      pNVar9 = internal::MetadataTree::remove_first_in_path(&this->sT->tree,local_40,attr);
    }
    local_78.m_value.m_v.type_and_size = (pNVar9->m_data).m_v.type_and_size;
    local_78.m_value.m_v.value = (pNVar9->m_data).m_v.value;
    local_78.m_node = pNVar9;
    Blackboard::set(pBVar11,key,&local_78,-1 < (char)uVar4);
  }
  else {
LAB_001e169a:
    Blackboard::del(pBVar11,key);
  }
  pthread_mutex_unlock((pthread_mutex_t *)pmVar13);
LAB_001e16ad:
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::end(const Attribute& attr)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    cali_id_t   key         = get_blackboard_key(attr.id(), prop);
    BlackboardEntry current = { Entry(), Entry( ) };

    std::lock_guard<::siglock> g(sT->lock);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        current = load_current_entry(attr, key, sT->thread_blackboard);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        current = load_current_entry(attr, key, sG->process_blackboard);
    } else
        return;

    if (current.entry.empty()) {
        sT->stack_error = true;
        return;
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_end_evt(this, channel.body(), attr, current.entry.value());

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_end(attr, prop, current, key, sT->thread_blackboard, sT->tree);
    else {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_end(attr, prop, current, key, sG->process_blackboard, sT->tree);
    }
}